

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O2

void __thiscall
YAML::SingleDocParser::ParseAnchor(SingleDocParser *this,anchor_t *anchor,string *anchor_name)

{
  Token *pTVar1;
  anchor_t aVar2;
  ParserException *this_00;
  allocator local_49;
  string local_48;
  
  pTVar1 = Scanner::peek(this->m_scanner);
  if (*anchor == 0) {
    std::__cxx11::string::_M_assign((string *)anchor_name);
    aVar2 = RegisterAnchor(this,&pTVar1->value);
    *anchor = aVar2;
    Scanner::pop(this->m_scanner);
    return;
  }
  this_00 = (ParserException *)__cxa_allocate_exception(0x40);
  std::__cxx11::string::string
            ((string *)&local_48,"cannot assign multiple anchors to the same node",&local_49);
  ParserException::ParserException(this_00,&pTVar1->mark,&local_48);
  __cxa_throw(this_00,&ParserException::typeinfo,BadConversion::~BadConversion);
}

Assistant:

void SingleDocParser::ParseAnchor(anchor_t& anchor, std::string& anchor_name) {
  Token& token = m_scanner.peek();
  if (anchor)
    throw ParserException(token.mark, ErrorMsg::MULTIPLE_ANCHORS);

  anchor_name = token.value;
  anchor = RegisterAnchor(token.value);
  m_scanner.pop();
}